

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.h
# Opt level: O0

_Bool sha512_block_write(sha512_block *blk,void **vdata,size_t *len)

{
  void *__src;
  bool bVar1;
  size_t local_50;
  size_t chunkbits;
  uint8_t *p;
  size_t chunk;
  size_t blkleft;
  size_t *len_local;
  void **vdata_local;
  sha512_block *blk_local;
  
  local_50 = 0x80 - blk->used;
  if (*len < local_50) {
    local_50 = *len;
  }
  __src = *vdata;
  memcpy(blk->block + blk->used,__src,local_50);
  *vdata = (void *)((long)__src + local_50);
  *len = *len - local_50;
  blk->used = local_50 + blk->used;
  blk->lenlo = local_50 * 8 + blk->lenlo;
  blk->lenhi = (long)(int)(uint)(blk->lenlo < local_50 * 8) + blk->lenhi;
  bVar1 = blk->used == 0x80;
  if (bVar1) {
    blk->used = 0;
  }
  return bVar1;
}

Assistant:

static inline bool sha512_block_write(
    sha512_block *blk, const void **vdata, size_t *len)
{
    size_t blkleft = sizeof(blk->block) - blk->used;
    size_t chunk = *len < blkleft ? *len : blkleft;

    const uint8_t *p = *vdata;
    memcpy(blk->block + blk->used, p, chunk);
    *vdata = p + chunk;
    *len -= chunk;
    blk->used += chunk;

    size_t chunkbits = chunk << 3;

    blk->lenlo += chunkbits;
    blk->lenhi += (blk->lenlo < chunkbits);

    if (blk->used == sizeof(blk->block)) {
        blk->used = 0;
        return true;
    }

    return false;
}